

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  socket_t sock;
  time_t read_timeout_sec;
  time_t read_timeout_usec;
  time_t write_timeout_sec;
  time_t write_timeout_usec;
  bool bVar1;
  function<bool_(httplib::Stream_&)> local_40;
  function<bool_(httplib::Stream_&)> *local_20;
  function<bool_(httplib::Stream_&)> *callback_local;
  Socket *socket_local;
  ClientImpl *this_local;
  
  sock = socket->sock;
  read_timeout_sec = this->read_timeout_sec_;
  read_timeout_usec = this->read_timeout_usec_;
  write_timeout_sec = this->write_timeout_sec_;
  write_timeout_usec = this->write_timeout_usec_;
  local_20 = callback;
  callback_local = (function<bool_(httplib::Stream_&)> *)socket;
  socket_local = (Socket *)this;
  std::function<bool_(httplib::Stream_&)>::function(&local_40,callback);
  bVar1 = detail::process_client_socket
                    (sock,read_timeout_sec,read_timeout_usec,write_timeout_sec,write_timeout_usec,
                     &local_40);
  std::function<bool_(httplib::Stream_&)>::~function(&local_40);
  return bVar1;
}

Assistant:

inline bool
        ClientImpl::process_socket(const Socket& socket,
            std::function<bool(Stream& strm)> callback) {
        return detail::process_client_socket(
            socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
            write_timeout_usec_, std::move(callback));
    }